

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  Environment *this;
  RefData<vk::Handle<(vk::HandleType)22>_> data;
  ulong __n;
  TestContext *pTVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  Unique<vk::Handle<(vk::HandleType)22>_> *this_01;
  reference this_02;
  allocator<char> local_321;
  string local_320;
  undefined1 local_2f9;
  Move<vk::Handle<(vk::HandleType)22>_> local_2f8;
  RefData<vk::Handle<(vk::HandleType)22>_> local_2d8;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> local_2b8;
  uint local_2a4;
  char *pcStack_2a0;
  deUint32 ndx;
  MessageBuilder local_298;
  undefined4 local_118;
  deUint32 watchdogInterval;
  allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_> local_101;
  undefined1 local_100 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  objects;
  Resources res;
  Environment env;
  deUint32 numObjects;
  Parameters *params_local;
  Context *context_local;
  
  env._52_4_ = DescriptorSet::getMaxConcurrent(context,params);
  this = (Environment *)
         &res.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
          deleter.m_allocator;
  Environment::Environment(this,context,env._52_4_);
  DescriptorSet::Resources::Resources
            ((Resources *)
             &objects.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this,params);
  __n = (ulong)(uint)env._52_4_;
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>::
  allocator(&local_101);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
            *)local_100,__n,&local_101);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>::
  ~allocator(&local_101);
  local_118 = 0x400;
  pTVar1 = Context::getTestContext(context);
  this_00 = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_298,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_298,(char (*) [10])"Creating ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)&env.field_0x34);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x13776be);
  pcStack_2a0 = ::vk::getTypeName<vk::Handle<(vk::HandleType)22>>();
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&stack0xfffffffffffffd60);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [9])0x13477db);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_298);
  for (local_2a4 = 0; local_2a4 < (uint)env._52_4_; local_2a4 = local_2a4 + 1) {
    this_01 = (Unique<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
    local_2f9 = 1;
    DescriptorSet::create
              (&local_2f8,
               (Environment *)
               &res.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data
                .deleter.m_allocator,
               (Resources *)
               &objects.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,params);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_2d8,(Move *)&local_2f8);
    data.deleter.m_deviceIface = local_2d8.deleter.m_deviceIface;
    data.object.m_internal = local_2d8.object.m_internal;
    data.deleter.m_device = local_2d8.deleter.m_device;
    data.deleter.m_pool.m_internal = local_2d8.deleter.m_pool.m_internal;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique(this_01,data);
    local_2f9 = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::SharedPtr
              (&local_2b8,this_01);
    this_02 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                            *)local_100,(ulong)local_2a4);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
              (this_02,&local_2b8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr(&local_2b8);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_2f8);
    if ((local_2a4 != 0) && ((local_2a4 & 0x3ff) == 0)) {
      pTVar1 = Context::getTestContext(context);
      tcu::TestContext::touchWatchdog(pTVar1);
    }
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::clear((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
           *)local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"Ok",&local_321);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
             *)local_100);
  DescriptorSet::Resources::~Resources
            ((Resources *)
             &objects.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}